

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O2

int luaB_print(lua_State *L)

{
  int iVar1;
  size_t in_RAX;
  char *__ptr;
  int iVar2;
  uint idx;
  size_t l;
  
  l = in_RAX;
  iVar1 = lua_gettop(L);
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  for (idx = 1; idx - iVar2 != 1; idx = idx + 1) {
    __ptr = luaL_tolstring(L,idx,&l);
    if (1 < idx) {
      fputc(9,_stdout);
    }
    fwrite(__ptr,1,l,_stdout);
    lua_settop(L,-2);
  }
  fputc(10,_stdout);
  fflush(_stdout);
  return 0;
}

Assistant:

static int luaB_print (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int i;
  for (i = 1; i <= n; i++) {  /* for each argument */
    size_t l;
    const char *s = luaL_tolstring(L, i, &l);  /* convert it to string */
    if (i > 1)  /* not the first element? */
      lua_writestring("\t", 1);  /* add a tab before it */
    lua_writestring(s, l);  /* print it */
    lua_pop(L, 1);  /* pop result */
  }
  lua_writeline();
  return 0;
}